

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void jsonnet::internal::ensureCleanNewline(Fodder *fodder)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  Fodder *in_stack_ffffffffffffffa0;
  uint indent;
  uint in_stack_ffffffffffffffa8;
  Kind in_stack_ffffffffffffffac;
  FodderElement *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  FodderElement *in_stack_ffffffffffffffe8;
  Fodder *in_stack_fffffffffffffff0;
  
  bVar1 = fodder_has_clean_endline(in_stack_ffffffffffffffa0);
  if (!bVar1) {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    indent = (uint)((ulong)&local_48 >> 0x20);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x35ec04);
    FodderElement::FodderElement
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,indent,
               in_RDI);
    fodder_push_back(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    FodderElement::~FodderElement((FodderElement *)0x35ec35);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

static inline void ensureCleanNewline(Fodder &fodder)
{
    if (!fodder_has_clean_endline(fodder)) {
        fodder_push_back(fodder, FodderElement(FodderElement::Kind::LINE_END, 0, 0, {}));
    }
}